

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O0

void __thiscall cppjit::builder::builder::builder(builder *this,string *kernel_name,bool verbose)

{
  allocator local_1a;
  byte local_19;
  string *psStack_18;
  bool verbose_local;
  string *kernel_name_local;
  builder *this_local;
  
  this->_vptr_builder = (_func_int **)&PTR___cxa_pure_virtual_00110c80;
  local_19 = verbose;
  psStack_18 = kernel_name;
  kernel_name_local = (string *)this;
  std::__cxx11::string::string((string *)&this->kernel_name,(string *)kernel_name);
  this->verbose = (bool)(local_19 & 1);
  this->do_cleanup = true;
  this->has_source_ = false;
  this->has_inline_source_ = false;
  std::__cxx11::string::string((string *)&this->source);
  std::__cxx11::string::string((string *)&this->source_dir);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->compile_dir,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  this->compile_dir_created = false;
  this->kernel_library = (void *)0x0;
  return;
}

Assistant:

builder(const std::string &kernel_name, bool verbose = false)
      : kernel_name(kernel_name),
        verbose(verbose),
        do_cleanup(true),
        has_source_(false),
        has_inline_source_(false),
        // source_dir(DEFAULT_KERNEL_COMPILE_DIR),
        compile_dir(""),
        compile_dir_created(false),
        kernel_library(nullptr) {}